

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O0

int64_t pick_wedge_fixed_sign
                  (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int16_t *residual1,int16_t *diff10,
                  int8_t wedge_sign,int8_t *best_wedge_index,uint64_t *best_sse)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  uint64_t uVar6;
  long lVar7;
  int16_t *in_RCX;
  BLOCK_SIZE in_DL;
  AV1_COMP *in_RSI;
  int16_t *in_R8;
  undefined1 in_R9B;
  int *unaff_retaddr;
  int64_t *in_stack_00000008;
  ulong *in_stack_00000010;
  int bd_round;
  int hbd;
  uint64_t sse;
  uint8_t *mask;
  int8_t wedge_types;
  int8_t wedge_index;
  int64_t best_rd;
  int64_t rd;
  int64_t dist;
  int rate;
  int N;
  int bh;
  int bw;
  MACROBLOCKD *xd;
  byte local_84;
  int8_t local_61;
  long local_60;
  long local_50;
  int local_48;
  undefined3 in_stack_ffffffffffffffd4;
  int num_samples;
  undefined7 in_stack_ffffffffffffffe8;
  AV1_COMP *cpi_00;
  
  num_samples = CONCAT13(in_R9B,in_stack_ffffffffffffffd4);
  bVar1 = block_size_wide[in_DL];
  bVar2 = block_size_high[in_DL];
  local_60 = 0x7fffffffffffffff;
  cpi_00 = in_RSI;
  iVar3 = get_wedge_types_lookup(in_DL);
  iVar4 = is_cur_buf_hbd((MACROBLOCKD *)((in_RSI->enc_quant_dequant_params).quants.y_quant + 0x19));
  if (iVar4 == 0) {
    local_84 = 0;
  }
  else {
    local_84 = ((char)*(undefined4 *)(in_RSI->enc_quant_dequant_params).quants.y_zbin[0xb3] + -8) *
               '\x02';
  }
  for (local_61 = '\0'; local_61 < (char)iVar3; local_61 = local_61 + '\x01') {
    puVar5 = av1_get_contiguous_soft_mask(local_61,(int8_t)((uint)num_samples >> 0x18),in_DL);
    uVar6 = (*av1_wedge_sse_from_residuals)(in_RCX,in_R8,puVar5,(uint)bVar1 * (uint)bVar2);
    model_rd_with_curvfit
              (cpi_00,(MACROBLOCK *)CONCAT17(in_DL,in_stack_ffffffffffffffe8),
               (BLOCK_SIZE)((ulong)in_RCX >> 0x38),(int)in_RCX,(int64_t)in_R8,num_samples,
               unaff_retaddr,in_stack_00000008);
    local_48 = *(int *)((cpi_00->enc_quant_dequant_params).quants.u_round_fp
                        [(ulong)in_DL * 4 + 0x30] + (long)local_61 * 2 + 4) + local_48;
    lVar7 = ((long)local_48 *
             (long)*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100
            >> 9) + local_50 * 0x80;
    if (lVar7 < local_60) {
      *(int8_t *)in_stack_00000008 = local_61;
      *in_stack_00000010 = uVar6 + (long)((1 << (local_84 & 0x1f)) >> 1) >> (local_84 & 0x3f);
      local_60 = lVar7;
    }
  }
  return local_60 -
         ((long)*(int *)((cpi_00->enc_quant_dequant_params).quants.u_round_fp
                         [(ulong)in_DL * 4 + 0x30] + (long)(char)*in_stack_00000008 * 2 + 4) *
          (long)*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant_fp[0x20] + 4) + 0x100 >>
         9);
}

Assistant:

static int64_t pick_wedge_fixed_sign(
    const AV1_COMP *const cpi, const MACROBLOCK *const x,
    const BLOCK_SIZE bsize, const int16_t *const residual1,
    const int16_t *const diff10, const int8_t wedge_sign,
    int8_t *const best_wedge_index, uint64_t *best_sse) {
  const MACROBLOCKD *const xd = &x->e_mbd;

  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int N = bw * bh;
  assert(N >= 64);
  int rate;
  int64_t dist;
  int64_t rd, best_rd = INT64_MAX;
  int8_t wedge_index;
  const int8_t wedge_types = get_wedge_types_lookup(bsize);
  const uint8_t *mask;
  uint64_t sse;
  const int hbd = is_cur_buf_hbd(xd);
  const int bd_round = hbd ? (xd->bd - 8) * 2 : 0;
  for (wedge_index = 0; wedge_index < wedge_types; ++wedge_index) {
    mask = av1_get_contiguous_soft_mask(wedge_index, wedge_sign, bsize);
    sse = av1_wedge_sse_from_residuals(residual1, diff10, mask, N);
    sse = ROUND_POWER_OF_TWO(sse, bd_round);

    model_rd_sse_fn[MODELRD_TYPE_MASKED_COMPOUND](cpi, x, bsize, 0, sse, N,
                                                  &rate, &dist);
    rate += x->mode_costs.wedge_idx_cost[bsize][wedge_index];
    rd = RDCOST(x->rdmult, rate, dist);

    if (rd < best_rd) {
      *best_wedge_index = wedge_index;
      best_rd = rd;
      *best_sse = sse;
    }
  }
  return best_rd -
         RDCOST(x->rdmult,
                x->mode_costs.wedge_idx_cost[bsize][*best_wedge_index], 0);
}